

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOD.h
# Opt level: O0

ResultT * __thiscall dg::AllMaxPath::compute(AllMaxPath *this,CDGraph *graph)

{
  bool bVar1;
  undefined8 in_RDX;
  CDNode **in_RSI;
  CDGraph *in_RDI;
  pair<std::_Rb_tree_iterator<std::pair<dg::CDNode_*const,_const_dg::ADT::SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::MapImpl<unsigned_long,_unsigned_long,_std::map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>_&>_>,_bool>
  pVar2;
  ContainedType *nd;
  node_iterator __end2;
  node_iterator __begin2;
  CDGraph *__range2;
  ResultT *res;
  CDGraph *this_00;
  _Rb_tree_iterator<std::pair<dg::CDNode_*const,_const_dg::ADT::SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::MapImpl<unsigned_long,_unsigned_long,_std::map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>_&>_>
  in_stack_ffffffffffffffb0;
  iterator local_30;
  undefined8 local_28;
  undefined1 local_19;
  undefined8 local_18;
  
  local_19 = 0;
  this_00 = in_RDI;
  local_18 = in_RDX;
  std::
  map<dg::CDNode_*,_const_dg::ADT::SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::MapImpl<unsigned_long,_unsigned_long,_std::map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>_&,_std::less<dg::CDNode_*>,_std::allocator<std::pair<dg::CDNode_*const,_const_dg::ADT::SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::MapImpl<unsigned_long,_unsigned_long,_std::map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>_&>_>_>
  ::map((map<dg::CDNode_*,_const_dg::ADT::SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::MapImpl<unsigned_long,_unsigned_long,_std::map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>_&,_std::less<dg::CDNode_*>,_std::allocator<std::pair<dg::CDNode_*const,_const_dg::ADT::SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::MapImpl<unsigned_long,_unsigned_long,_std::map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>_&>_>_>
         *)0x25ab93);
  CDGraph::size((CDGraph *)0x25ab9d);
  std::
  unordered_map<dg::CDNode_*,_dg::AllMaxPath::Info,_std::hash<dg::CDNode_*>,_std::equal_to<dg::CDNode_*>,_std::allocator<std::pair<dg::CDNode_*const,_dg::AllMaxPath::Info>_>_>
  ::reserve((unordered_map<dg::CDNode_*,_dg::AllMaxPath::Info,_std::hash<dg::CDNode_*>,_std::equal_to<dg::CDNode_*>,_std::allocator<std::pair<dg::CDNode_*const,_dg::AllMaxPath::Info>_>_>
             *)this_00,(size_type)in_RDI);
  local_28 = local_18;
  local_30._M_current =
       (unique_ptr<dg::CDNode,_std::default_delete<dg::CDNode>_> *)CDGraph::begin(in_RDI);
  CDGraph::end(in_RDI);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<std::unique_ptr<dg::CDNode,_std::default_delete<dg::CDNode>_>_*,_std::vector<std::unique_ptr<dg::CDNode,_std::default_delete<dg::CDNode>_>,_std::allocator<std::unique_ptr<dg::CDNode,_std::default_delete<dg::CDNode>_>_>_>_>
                             *)this_00,
                            (__normal_iterator<std::unique_ptr<dg::CDNode,_std::default_delete<dg::CDNode>_>_*,_std::vector<std::unique_ptr<dg::CDNode,_std::default_delete<dg::CDNode>_>,_std::allocator<std::unique_ptr<dg::CDNode,_std::default_delete<dg::CDNode>_>_>_>_>
                             *)in_RDI), bVar1) {
    CDGraph::node_iterator::operator*((node_iterator *)0x25abf1);
    compute((AllMaxPath *)res,(CDGraph *)this,(CDNode *)graph);
    std::
    unordered_map<dg::CDNode_*,_dg::AllMaxPath::Info,_std::hash<dg::CDNode_*>,_std::equal_to<dg::CDNode_*>,_std::allocator<std::pair<dg::CDNode_*const,_dg::AllMaxPath::Info>_>_>
    ::operator[]((unordered_map<dg::CDNode_*,_dg::AllMaxPath::Info,_std::hash<dg::CDNode_*>,_std::equal_to<dg::CDNode_*>,_std::allocator<std::pair<dg::CDNode_*const,_dg::AllMaxPath::Info>_>_>
                  *)this_00,(key_type *)in_RDI);
    pVar2 = std::
            map<dg::CDNode*,dg::ADT::SparseBitvectorImpl<unsigned_long,unsigned_long,unsigned_long,1ul,dg::MapImpl<unsigned_long,unsigned_long,std::map<unsigned_long,unsigned_long,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>>>>const&,std::less<dg::CDNode*>,std::allocator<std::pair<dg::CDNode*const,dg::ADT::SparseBitvectorImpl<unsigned_long,unsigned_long,unsigned_long,1ul,dg::MapImpl<unsigned_long,unsigned_long,std::map<unsigned_long,unsigned_long,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>>>>const&>>>
            ::
            emplace<dg::CDNode*&,dg::ADT::SparseBitvectorImpl<unsigned_long,unsigned_long,unsigned_long,1ul,dg::MapImpl<unsigned_long,unsigned_long,std::map<unsigned_long,unsigned_long,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>>>>&>
                      ((map<dg::CDNode_*,_const_dg::ADT::SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::MapImpl<unsigned_long,_unsigned_long,_std::map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>_&,_std::less<dg::CDNode_*>,_std::allocator<std::pair<dg::CDNode_*const,_const_dg::ADT::SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::MapImpl<unsigned_long,_unsigned_long,_std::map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>_&>_>_>
                        *)in_stack_ffffffffffffffb0._M_node,in_RSI,
                       (SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::MapImpl<unsigned_long,_unsigned_long,_std::map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>
                        *)this_00);
    in_stack_ffffffffffffffb0 = pVar2.first._M_node;
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<dg::CDNode,_std::default_delete<dg::CDNode>_>_*,_std::vector<std::unique_ptr<dg::CDNode,_std::default_delete<dg::CDNode>_>,_std::allocator<std::unique_ptr<dg::CDNode,_std::default_delete<dg::CDNode>_>_>_>_>
    ::operator++(&local_30);
  }
  return (ResultT *)this_00;
}

Assistant:

ResultT compute(CDGraph &graph) {
        ResultT res;

        data.reserve(graph.size());

        for (auto *nd : graph) {
            compute(graph, nd);
            res.emplace(nd, data[nd].colors);
        }

        return res;
    }